

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O0

void __thiscall
iu_Matcher_x_iutest_x_AllOf_Test::~iu_Matcher_x_iutest_x_AllOf_Test
          (iu_Matcher_x_iutest_x_AllOf_Test *this)

{
  iu_Matcher_x_iutest_x_AllOf_Test *this_local;
  
  ~iu_Matcher_x_iutest_x_AllOf_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(Matcher, AllOf)
{
    IUTEST_EXPECT_THAT("hoge", AllOf( StartsWith("ho"), EndsWith("ge")));
    IUTEST_EXPECT_THAT("9347812650", AllOf(
          HasSubstr("0")
        , HasSubstr("1")
        , HasSubstr("2")
        , HasSubstr("3")
        , HasSubstr("4")
        , HasSubstr("5")
        , HasSubstr("6")
        , HasSubstr("7")
        , HasSubstr("8")
    ));
}